

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O3

RotationX<std::complex<double>_> * __thiscall
qclab::qgates::RotationX<std::complex<double>_>::operator*=
          (RotationX<std::complex<double>_> *this,RotationX<std::complex<double>_> *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = (*(this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  iVar6 = (*(rhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar5 == iVar6) {
    dVar2 = (rhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
    dVar3 = (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
    dVar4 = (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
    dVar1 = (rhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
    (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_ =
         dVar2 * dVar3 + -dVar4 * dVar1;
    (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_ =
         dVar2 * dVar4 + dVar3 * dVar1;
    return this;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/qgates/RotationX.hpp"
                ,0xa3,
                "RotationX<T> &qclab::qgates::RotationX<std::complex<double>>::operator*=(const RotationX<T> &) [T = std::complex<double>]"
               );
}

Assistant:

inline RotationX< T >& operator*=( const RotationX< T >& rhs ) {
          assert( this->qubit() == rhs.qubit() ) ;
          this->rotation_ *= rhs.rotation() ;
          return *this ;
        }